

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.h
# Opt level: O2

void __thiscall slang::parsing::ParserBase::Window::Window(Window *this,Preprocessor *source)

{
  Token *pTVar1;
  long lVar2;
  
  this->tokenSource = source;
  this->buffer = (Token *)0x0;
  Token::Token(&this->currentToken);
  Token::Token(&this->lastConsumed);
  this->currentOffset = 0;
  this->count = 0;
  this->capacity = 0x20;
  pTVar1 = (Token *)operator_new__(0x200);
  lVar2 = 0;
  do {
    Token::Token((Token *)((long)&pTVar1->kind + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x200);
  this->buffer = pTVar1;
  return;
}

Assistant:

explicit Window(Preprocessor& source) : tokenSource(source) {
            capacity = 32;
            buffer = new Token[capacity];
        }